

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

FILE * pugi::impl::anon_unknown_0::open_file_wide(wchar_t *path,wchar_t *mode)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  wchar_t wVar17;
  long lVar18;
  char *buffer;
  FILE *pFVar19;
  ulong uVar20;
  size_t size;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  char mode_ascii [4];
  char local_2c [4];
  undefined1 auVar25 [24];
  undefined1 auVar27 [32];
  undefined1 auVar26 [32];
  undefined1 auVar34 [64];
  
  if (path == (wchar_t *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x1375,
                  "char *pugi::impl::(anonymous namespace)::convert_path_heap(const wchar_t *)");
  }
  lVar18 = -4;
  do {
    lVar16 = lVar18 + 4;
    lVar18 = lVar18 + 4;
  } while (*(int *)((long)path + lVar16) != 0);
  if (lVar18 == 0) {
    size = 0;
  }
  else {
    auVar29 = vpbroadcastq_avx512f();
    auVar38 = ZEXT1664((undefined1  [16])0x0);
    uVar20 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar28._8_4_ = 0x10000;
    auVar28._0_8_ = 0x1000000010000;
    auVar28._12_4_ = 0x10000;
    auVar28._16_4_ = 0x10000;
    auVar28._20_4_ = 0x10000;
    auVar28._24_4_ = 0x10000;
    auVar28._28_4_ = 0x10000;
    auVar36._8_4_ = 0x80;
    auVar36._0_8_ = 0x8000000080;
    auVar36._12_4_ = 0x80;
    auVar36._16_4_ = 0x80;
    auVar36._20_4_ = 0x80;
    auVar36._24_4_ = 0x80;
    auVar36._28_4_ = 0x80;
    auVar37._8_4_ = 0x800;
    auVar37._0_8_ = 0x80000000800;
    auVar37._12_4_ = 0x800;
    auVar37._16_4_ = 0x800;
    auVar37._20_4_ = 0x800;
    auVar37._24_4_ = 0x800;
    auVar37._28_4_ = 0x800;
    auVar31 = vpbroadcastq_avx512f(ZEXT816(4));
    do {
      auVar32 = vmovdqa64_avx512f(auVar38);
      auVar38 = vpbroadcastq_avx512f();
      auVar38 = vporq_avx512f(auVar38,auVar30);
      uVar15 = vpcmpuq_avx512f(auVar38,auVar29,2);
      auVar26 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(path + uVar20));
      lVar16 = CONCAT44((uint)((byte)(uVar15 >> 1) & 1) * auVar26._4_4_,
                        (uint)((byte)uVar15 & 1) * auVar26._0_4_);
      auVar24._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar26._8_4_;
      auVar24._0_8_ = lVar16;
      auVar24._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar26._12_4_;
      auVar25._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar26._16_4_;
      auVar25._0_16_ = auVar24;
      auVar25._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar26._20_4_;
      auVar27._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar26._24_4_;
      auVar27._0_24_ = auVar25;
      auVar27._28_4_ = (uint)(byte)(uVar15 >> 7) * auVar26._28_4_;
      uVar14 = vpcmpud_avx512vl(auVar27,auVar28,1);
      uVar22 = vpcmpud_avx512vl(auVar27,auVar36,5);
      uVar22 = uVar15 & uVar14 & uVar22;
      uVar23 = vpcmpud_avx512vl(auVar27,auVar37,5);
      uVar23 = uVar22 & uVar23;
      uVar21 = vpcmpud_avx512vl(auVar27,auVar37,1);
      uVar22 = uVar22 & uVar21;
      uVar21 = vpcmpud_avx512vl(auVar27,auVar36,1);
      uVar21 = uVar15 & uVar14 & uVar21;
      auVar38._8_8_ = 1;
      auVar38._0_8_ = 1;
      auVar38._16_8_ = 1;
      auVar38._24_8_ = 1;
      auVar38._32_8_ = 1;
      auVar38._40_8_ = 1;
      auVar38._48_8_ = 1;
      auVar38._56_8_ = 1;
      auVar38 = vpblendmq_avx512f(auVar31,auVar38);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar4 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar33 = vpbroadcastq_avx512f(ZEXT816(2));
      bVar2 = (bool)((byte)uVar22 & 1);
      bVar5 = (bool)((byte)(uVar22 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar22 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar22 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar22 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar22 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar22 >> 6) & 1);
      auVar34 = vpbroadcastq_avx512f(ZEXT816(3));
      bVar3 = (bool)((byte)uVar23 & 1);
      auVar35._0_8_ =
           (ulong)bVar3 * auVar34._0_8_ |
           (ulong)!bVar3 *
           ((ulong)bVar2 * auVar33._0_8_ |
           (ulong)!bVar2 * ((ulong)bVar1 * auVar38._0_8_ | (ulong)!bVar1 * lVar16));
      bVar1 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar35._8_8_ =
           (ulong)bVar1 * auVar34._8_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar5 * auVar33._8_8_ |
           (ulong)!bVar5 * ((ulong)bVar4 * auVar38._8_8_ | (ulong)!bVar4 * auVar24._8_8_));
      bVar1 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar35._16_8_ =
           (ulong)bVar1 * auVar34._16_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar7 * auVar33._16_8_ |
           (ulong)!bVar7 * ((ulong)bVar6 * auVar38._16_8_ | (ulong)!bVar6 * auVar25._16_8_));
      bVar1 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar35._24_8_ =
           (ulong)bVar1 * auVar34._24_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar9 * auVar33._24_8_ |
           (ulong)!bVar9 * ((ulong)bVar8 * auVar38._24_8_ | (ulong)!bVar8 * auVar27._24_8_));
      bVar1 = (bool)((byte)(uVar23 >> 4) & 1);
      auVar35._32_8_ =
           (ulong)bVar1 * auVar34._32_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar10 * auVar33._32_8_ |
           (ulong)!bVar10 * (ulong)((byte)(uVar21 >> 4) & 1) * auVar38._32_8_);
      bVar1 = (bool)((byte)(uVar23 >> 5) & 1);
      auVar35._40_8_ =
           (ulong)bVar1 * auVar34._40_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar11 * auVar33._40_8_ |
           (ulong)!bVar11 * (ulong)((byte)(uVar21 >> 5) & 1) * auVar38._40_8_);
      bVar1 = (bool)((byte)(uVar23 >> 6) & 1);
      auVar35._48_8_ =
           (ulong)bVar1 * auVar34._48_8_ |
           (ulong)!bVar1 *
           ((ulong)bVar12 * auVar33._48_8_ |
           (ulong)!bVar12 * (ulong)((byte)(uVar21 >> 6) & 1) * auVar38._48_8_);
      auVar35._56_8_ =
           (uVar23 >> 7) * auVar34._56_8_ |
           (ulong)!SUB81(uVar23 >> 7,0) *
           ((uVar22 >> 7) * auVar33._56_8_ |
           (ulong)!SUB81(uVar22 >> 7,0) * (uVar21 >> 7) * auVar38._56_8_);
      auVar38 = vpaddq_avx512f(auVar32,auVar35);
      uVar20 = uVar20 + 8;
    } while (((lVar18 >> 2) + 7U & 0xfffffffffffffff8) != uVar20);
    auVar29 = vmovdqa64_avx512f(auVar38);
    bVar1 = (bool)((byte)uVar15 & 1);
    auVar30._0_8_ = (ulong)bVar1 * auVar29._0_8_ | (ulong)!bVar1 * auVar32._0_8_;
    bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar30._8_8_ = (ulong)bVar1 * auVar29._8_8_ | (ulong)!bVar1 * auVar32._8_8_;
    bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar30._16_8_ = (ulong)bVar1 * auVar29._16_8_ | (ulong)!bVar1 * auVar32._16_8_;
    bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar30._24_8_ = (ulong)bVar1 * auVar29._24_8_ | (ulong)!bVar1 * auVar32._24_8_;
    bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar30._32_8_ = (ulong)bVar1 * auVar29._32_8_ | (ulong)!bVar1 * auVar32._32_8_;
    bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar30._40_8_ = (ulong)bVar1 * auVar29._40_8_ | (ulong)!bVar1 * auVar32._40_8_;
    bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar30._48_8_ = (ulong)bVar1 * auVar29._48_8_ | (ulong)!bVar1 * auVar32._48_8_;
    auVar30._56_8_ = (uVar15 >> 7) * auVar29._56_8_ | (ulong)!SUB81(uVar15 >> 7,0) * auVar32._56_8_;
    auVar28 = vextracti64x4_avx512f(auVar30,1);
    auVar29 = vpaddq_avx512f(auVar30,ZEXT3264(auVar28));
    auVar24 = vpaddq_avx(auVar29._0_16_,auVar29._16_16_);
    auVar13 = vpshufd_avx(auVar24,0xee);
    auVar24 = vpaddq_avx(auVar24,auVar13);
    size = auVar24._0_8_;
  }
  buffer = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(size + 1);
  if (buffer == (char *)0x0) {
    buffer = (char *)0x0;
  }
  else {
    as_utf8_end(buffer,size,path,lVar18 >> 2);
    buffer[size] = '\0';
  }
  if (buffer == (char *)0x0) {
    pFVar19 = (FILE *)0x0;
  }
  else {
    local_2c[0] = '\0';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    wVar17 = *mode;
    if (wVar17 != L'\0') {
      lVar18 = 0;
      do {
        local_2c[lVar18] = (char)wVar17;
        wVar17 = mode[lVar18 + 1];
        lVar18 = lVar18 + 1;
      } while (wVar17 != L'\0');
    }
    pFVar19 = fopen(buffer,local_2c);
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (buffer);
  }
  return (FILE *)pFVar19;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}